

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O2

uint __thiscall
RigidBodyDynamics::Model::AddBody
          (Model *this,uint parent_id,SpatialTransform *joint_frame,Joint *joint,Body *body,
          string *body_name)

{
  uint uVar1;
  JointType JVar2;
  pointer pFVar3;
  pointer pJVar4;
  pointer pBVar5;
  pointer pBVar6;
  pointer pJVar7;
  pointer puVar8;
  Body *pBVar9;
  bool bVar10;
  reference this_00;
  iterator iVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  pair<RigidBodyDynamics::JointType,_unsigned_int> *ppVar14;
  iterator __position;
  ostream *poVar15;
  Joint *joint_00;
  int iVar16;
  uint i_1;
  char *pcVar17;
  string *this_01;
  uint i;
  uint uVar18;
  uint uVar19;
  uint movable_parent_id;
  Body *local_250;
  pair<RigidBodyDynamics::JointType,_unsigned_int> local_248;
  vector<RigidBodyDynamics::Joint,_std::allocator<RigidBodyDynamics::Joint>_> *local_240;
  vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
  joint_types;
  string local_1f8;
  string local_1d8;
  SpatialRigidBodyInertia rbi;
  SpatialTransform movable_parent_transform;
  
  uVar18 = joint->mJointType - JointTypeRevolute;
  joint_00 = (Joint *)(ulong)uVar18;
  local_250 = body;
  if (uVar18 < 10) {
    movable_parent_id = parent_id;
    Math::SpatialTransform::SpatialTransform(&movable_parent_transform);
    bVar10 = IsFixedBodyId(this,parent_id);
    if (bVar10) {
      uVar18 = parent_id - this->fixed_body_discriminator;
      pFVar3 = (this->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start;
      movable_parent_id = pFVar3[uVar18].mMovableParent;
      Math::SpatialTransform::operator=(&movable_parent_transform,&pFVar3[uVar18].mParentTransform);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->lambda,&movable_parent_id);
    pJVar4 = (this->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar18 = pJVar4[-1].mDoFCount;
    uVar1 = pJVar4[-1].q_index;
    local_240 = &this->mJoints;
    for (uVar19 = 0; uVar19 < joint->mDoFCount; uVar19 = uVar19 + 1) {
      rbi.m = (double)CONCAT44(rbi.m._4_4_,uVar19 + uVar18 + uVar1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&this->lambda_q,(uint *)&rbi);
    }
    rbi.m = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = 0.0;
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)&this->mu,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rbi);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&rbi);
    this_00 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::at(&this->mu,(ulong)movable_parent_id);
    rbi.m = (double)CONCAT44(rbi.m._4_4_,
                             (int)(((long)(this->mBodies).
                                          super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                          .
                                          super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->mBodies).
                                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                         .
                                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x70));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&rbi);
    Math::SpatialTransform::SpatialTransform((SpatialTransform *)&rbi);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
              (&(this->X_lambda).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ,(SpatialTransform *)&rbi);
    Math::SpatialTransform::SpatialTransform((SpatialTransform *)&rbi);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
              (&(this->X_base).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ,(SpatialTransform *)&rbi);
    pBVar9 = local_250;
    std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
    push_back(&(this->mBodies).
               super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
              ,local_250);
    if (body_name->_M_string_length != 0) {
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find(&(this->mBodyNameMap)._M_t,body_name);
      if ((_Rb_tree_header *)iVar11._M_node !=
          &(this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header) {
        poVar15 = std::operator<<((ostream *)&std::cerr,"Error: Body with name \'");
        poVar15 = std::operator<<(poVar15,(string *)body_name);
        pcVar17 = "\' already exists!";
        goto LAB_0013da74;
      }
      pBVar5 = (this->mBodies).
               super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
               .
               super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pBVar6 = (this->mBodies).
               super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
               .
               super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[](&this->mBodyNameMap,body_name);
      *pmVar12 = (int)(((long)pBVar5 - (long)pBVar6) / 0x70) - 1;
    }
    rbi.Ixx = 0.0;
    rbi.Iyx = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] = 0.0;
    rbi.m = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = 0.0;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
    emplace_back<SpatialVector_t>
              (&(this->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
               (SpatialVector_t *)&rbi);
    rbi.Ixx = 0.0;
    rbi.Iyx = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] = 0.0;
    rbi.m = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = 0.0;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
    emplace_back<SpatialVector_t>
              (&(this->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
               (SpatialVector_t *)&rbi);
    uVar18 = (int)(((long)(this->mJoints).
                          super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->mJoints).
                         super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18) - 1;
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    push_back(&local_240->
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ,joint);
    pJVar4 = (this->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->mJoints).
    super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>.
    super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].q_index =
         pJVar4[uVar18].mDoFCount + pJVar4[uVar18].q_index;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              (&(this->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
               joint->mJointAxes);
    Math::SpatialTransform::SpatialTransform((SpatialTransform *)&rbi);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
              (&(this->X_J).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ,(SpatialTransform *)&rbi);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              (&(this->v_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
               joint->mJointAxes);
    rbi.Ixx = 0.0;
    rbi.Iyx = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] = 0.0;
    rbi.m = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = 0.0;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
    emplace_back<SpatialVector_t>
              (&(this->c_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
               (SpatialVector_t *)&rbi);
    joint_types.
    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
              ((PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>> *)&rbi,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                *)&joint_types);
    std::
    vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
    ::emplace_back<Eigen::Matrix<double,6,3,0,6,3>>
              ((vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
                *)&this->multdof3_S,(Matrix<double,_6,_3,_0,_6,_3> *)&rbi);
    joint_types.
    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
              ((PlainObjectBase<Eigen::Matrix<double,6,3,0,6,3>> *)&rbi,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                *)&joint_types);
    std::
    vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
    ::emplace_back<Eigen::Matrix<double,6,3,0,6,3>>
              ((vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
                *)&this->multdof3_U,(Matrix<double,_6,_3,_0,_6,_3> *)&rbi);
    joint_types.
    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&rbi,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&joint_types);
    std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::emplace_back<Matrix3_t>
              (&this->multdof3_Dinv,(Matrix3_t *)&rbi);
    joint_types.
    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&rbi,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&joint_types);
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::emplace_back<Vector3_t>
              (&this->multdof3_u,(Vector3_t *)&rbi);
    rbi.m = (double)((ulong)rbi.m & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->multdof3_w_index,(uint *)&rbi);
    this->dof_count = this->dof_count + joint->mDoFCount;
    pJVar4 = (this->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pJVar7 = (this->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar8 = (this->multdof3_w_index).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar16 = 0;
    for (uVar13 = 1; uVar13 < (ulong)(((long)pJVar7 - (long)pJVar4) / 0x18);
        uVar13 = (ulong)((int)uVar13 + 1)) {
      if (pJVar4[uVar13].mJointType == JointTypeSpherical) {
        puVar8[uVar13] = this->dof_count + iVar16;
        iVar16 = iVar16 + 1;
      }
    }
    this->q_size = iVar16 + this->dof_count;
    this->qdot_size = this->qdot_size + joint->mDoFCount;
    Math::SpatialTransform::operator*
              ((SpatialTransform *)&rbi,joint_frame,&movable_parent_transform);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
              (&(this->X_T).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ,(SpatialTransform *)&rbi);
    rbi.Ixx = 0.0;
    rbi.Iyx = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] = 0.0;
    rbi.m = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = 0.0;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
    emplace_back<SpatialVector_t>
              (&(this->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
               (SpatialVector_t *)&rbi);
    joint_types.
    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&rbi,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
                *)&joint_types);
    std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::
    emplace_back<SpatialMatrix_t>
              (&(this->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
               ,(SpatialMatrix_t *)&rbi);
    rbi.Ixx = 0.0;
    rbi.Iyx = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] = 0.0;
    rbi.m = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = 0.0;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
    emplace_back<SpatialVector_t>
              (&(this->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
               ,(SpatialVector_t *)&rbi);
    rbi.Ixx = 0.0;
    rbi.Iyx = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] = 0.0;
    rbi.m = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = 0.0;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
    emplace_back<SpatialVector_t>
              (&(this->U).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
               (SpatialVector_t *)&rbi);
    rbi.m = (double)(((long)(this->mBodies).
                            super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                            .
                            super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mBodies).
                           super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x70);
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = 0.0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              (&this->d,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)&rbi);
    rbi.m = (double)(((long)(this->mBodies).
                            super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                            .
                            super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mBodies).
                           super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x70);
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = 0.0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              (&this->u,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)&rbi);
    rbi.Ixx = 0.0;
    rbi.Iyx = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] = 0.0;
    rbi.m = 0.0;
    rbi.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = 0.0;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
    emplace_back<SpatialVector_t>
              (&(this->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
               (SpatialVector_t *)&rbi);
    Math::SpatialRigidBodyInertia::createFromMassComInertiaC
              (&rbi,pBVar9->mMass,&pBVar9->mCenterOfMass,&pBVar9->mInertia);
    std::
    vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
    ::push_back(&(this->Ic).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                ,&rbi);
    std::
    vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
    ::push_back(&(this->I).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                ,&rbi);
    joint_types.
    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    joint_types.
    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    joint_types.
    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
    emplace_back<SpatialVector_t>
              (&(this->hc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
               ,(SpatialVector_t *)&joint_types);
    uVar13 = ((long)(this->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mBodies).
                   super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x70;
    if (uVar13 == this->fixed_body_discriminator) {
      poVar15 = std::operator<<((ostream *)&std::cerr,"Error: cannot add more than ");
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->fixed_body_discriminator);
      pcVar17 = " movable bodies. You need to modify Model::fixed_body_discriminator for this.";
LAB_0013da74:
      poVar15 = std::operator<<(poVar15,pcVar17);
      std::endl<char,std::char_traits<char>>(poVar15);
      abort();
    }
    this->previously_added_body_id = (int)uVar13 - 1;
    puVar8 = (this->mJointUpdateOrder).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->mJointUpdateOrder).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar8) {
      (this->mJointUpdateOrder).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar8;
    }
    joint_types.
    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    joint_types.
    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    joint_types.
    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar13 = 0;
    while( true ) {
      pJVar4 = (this->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->mJoints).
                         super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pJVar4) / 0x18) <=
          uVar13) break;
      local_248.first = pJVar4[uVar13].mJointType;
      local_248.second = (uint)uVar13;
      std::
      vector<std::pair<RigidBodyDynamics::JointType,unsigned_int>,std::allocator<std::pair<RigidBodyDynamics::JointType,unsigned_int>>>
      ::emplace_back<std::pair<RigidBodyDynamics::JointType,unsigned_int>>
                ((vector<std::pair<RigidBodyDynamics::JointType,unsigned_int>,std::allocator<std::pair<RigidBodyDynamics::JointType,unsigned_int>>>
                  *)&joint_types,&local_248);
      local_248.first =
           (local_240->
           super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           ).
           super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar13].mJointType;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&this->mJointUpdateOrder,&local_248.first);
      uVar13 = (ulong)((uint)uVar13 + 1);
    }
    puVar8 = (this->mJointUpdateOrder).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->mJointUpdateOrder).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar8) {
      (this->mJointUpdateOrder).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar8;
    }
    ppVar14 = joint_types.
              super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    while (ppVar14 !=
           joint_types.
           super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start) {
      JVar2 = (joint_types.
               super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first;
      __position._M_current =
           joint_types.
           super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      while (__position._M_current != ppVar14) {
        if ((__position._M_current)->first == JVar2) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this->mJointUpdateOrder,&(__position._M_current)->second);
          __position = std::
                       vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                       ::erase(&joint_types,__position._M_current);
          ppVar14 = joint_types.
                    super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          __position._M_current = __position._M_current + 1;
        }
      }
    }
    uVar18 = this->previously_added_body_id;
    std::
    _Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ::~_Vector_base(&joint_types.
                     super__Vector_base<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                   );
  }
  else {
    if (joint->mJointType == JointTypeFixed) {
      std::__cxx11::string::string((string *)&local_1d8,(string *)body_name);
      uVar18 = AddBodyFixedJoint(this,parent_id,joint_frame,joint_00,local_250,&local_1d8);
      this->previously_added_body_id = uVar18;
      this_01 = &local_1d8;
    }
    else {
      std::__cxx11::string::string((string *)&local_1f8,(string *)body_name);
      uVar18 = AddBodyMultiDofJoint(this,parent_id,joint_frame,joint,local_250,&local_1f8);
      this->previously_added_body_id = uVar18;
      this_01 = &local_1f8;
    }
    std::__cxx11::string::~string((string *)this_01);
    uVar18 = this->previously_added_body_id;
  }
  return uVar18;
}

Assistant:

unsigned int Model::AddBody (const unsigned int parent_id,
		const SpatialTransform &joint_frame,
		const Joint &joint,
		const Body &body,
		std::string body_name) {
	assert (lambda.size() > 0);
	assert (joint.mJointType != JointTypeUndefined);

	if (joint.mJointType == JointTypeFixed) {
		previously_added_body_id = AddBodyFixedJoint (*this, parent_id, joint_frame, joint, body, body_name);
		return previously_added_body_id;
	} else if ( (joint.mJointType == JointTypeSpherical) 
			|| (joint.mJointType == JointTypeEulerZYX) 
			|| (joint.mJointType == JointTypeEulerXYZ) 
			|| (joint.mJointType == JointTypeEulerYXZ) 
			|| (joint.mJointType == JointTypeTranslationXYZ) ) {
		// no action required
	} else if (joint.mJointType != JointTypePrismatic 
			&& joint.mJointType != JointTypeRevolute
			&& joint.mJointType != JointTypeRevoluteX
			&& joint.mJointType != JointTypeRevoluteY
			&& joint.mJointType != JointTypeRevoluteZ
			) {
		previously_added_body_id = AddBodyMultiDofJoint (*this, parent_id, joint_frame, joint, body, body_name);
		return previously_added_body_id;
	}

	// If we add the body to a fixed body we have to make sure that we
	// actually add it to its movable parent.
	unsigned int movable_parent_id = parent_id;
	SpatialTransform movable_parent_transform;

	if (IsFixedBodyId(parent_id)) {
		unsigned int fbody_id = parent_id - fixed_body_discriminator;
		movable_parent_id = mFixedBodies[fbody_id].mMovableParent;
		movable_parent_transform = mFixedBodies[fbody_id].mParentTransform;
	}

	// structural information
	lambda.push_back(movable_parent_id);
	unsigned int lambda_q_last = mJoints[mJoints.size() - 1].q_index;
	if (mJoints[mJoints.size() - 1].mDoFCount > 0)
		lambda_q_last = lambda_q_last + mJoints[mJoints.size() - 1].mDoFCount;
	for (unsigned int i = 0; i < joint.mDoFCount; i++) {
		lambda_q.push_back(lambda_q_last + i);
	}
	mu.push_back(std::vector<unsigned int>());
	mu.at(movable_parent_id).push_back(mBodies.size());

	// Bodies
	X_lambda.push_back(SpatialTransform());
	X_base.push_back(SpatialTransform());
	mBodies.push_back(body);

	if (body_name.size() != 0) {
		if (mBodyNameMap.find(body_name) != mBodyNameMap.end()) {
			std::cerr << "Error: Body with name '" << body_name << "' already exists!" << std::endl;
			assert (0);
			abort();
		}
		mBodyNameMap[body_name] = mBodies.size() - 1;
	}

	// state information
	v.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
	a.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

	// Joints
	unsigned int last_q_index = mJoints.size() - 1;
	mJoints.push_back(joint);
	mJoints[mJoints.size() - 1].q_index = mJoints[last_q_index].q_index + mJoints[last_q_index].mDoFCount; 

	S.push_back (joint.mJointAxes[0]);

	// Joint state variables
	X_J.push_back (SpatialTransform());
	v_J.push_back (joint.mJointAxes[0]);
	c_J.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

	// workspace for joints with 3 dof
	multdof3_S.push_back (Matrix63::Zero(6,3));
	multdof3_U.push_back (Matrix63::Zero());
	multdof3_Dinv.push_back (Matrix3d::Zero());
	multdof3_u.push_back (Vector3d::Zero());
	multdof3_w_index.push_back (0);

	dof_count = dof_count + joint.mDoFCount;

	// update the w components of the Quaternions. They are stored at the end
	// of the q vector
	int multdof3_joint_counter = 0;
	for (unsigned int i = 1; i < mJoints.size(); i++) {
		if (mJoints[i].mJointType == JointTypeSpherical) {
			multdof3_w_index[i] = dof_count + multdof3_joint_counter;
			multdof3_joint_counter++;
		}
	}

	q_size = dof_count + multdof3_joint_counter;
	qdot_size = qdot_size + joint.mDoFCount;

	// we have to invert the transformation as it is later always used from the
	// child bodies perspective.
	X_T.push_back(joint_frame * movable_parent_transform);

	// Dynamic variables
	c.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
	IA.push_back(SpatialMatrix::Zero(6,6));
	pA.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
	U.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

	d = VectorNd::Zero (mBodies.size());
	u = VectorNd::Zero (mBodies.size());

	f.push_back (SpatialVector (0., 0., 0., 0., 0., 0.));

	SpatialRigidBodyInertia rbi = SpatialRigidBodyInertia::createFromMassComInertiaC (body.mMass, body.mCenterOfMass, body.mInertia);

	Ic.push_back (rbi);
	I.push_back (rbi);
	hc.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

	if (mBodies.size() == fixed_body_discriminator) {
		std::cerr << "Error: cannot add more than " << fixed_body_discriminator << " movable bodies. You need to modify Model::fixed_body_discriminator for this." << std::endl;
		assert (0);
		abort();
	}
	
	previously_added_body_id = mBodies.size() - 1;

	mJointUpdateOrder.clear();

	// update the joint order computation
	std::vector<std::pair<JointType, unsigned int> > joint_types;
	for (unsigned int i = 0; i < mJoints.size(); i++) {
		joint_types.push_back (std::pair<JointType, unsigned int> (mJoints[i].mJointType,i));
		mJointUpdateOrder.push_back (mJoints[i].mJointType);
	}

	mJointUpdateOrder.clear();
	JointType current_joint_type = JointTypeUndefined;
	while (joint_types.size() != 0) {
		current_joint_type = joint_types[0].first;

		std::vector<std::pair<JointType, unsigned int> >::iterator type_iter = joint_types.begin();

		while (type_iter != joint_types.end()) {
			if (type_iter->first == current_joint_type) {
				mJointUpdateOrder.push_back (type_iter->second);
				type_iter = joint_types.erase (type_iter);
			} else {
				++type_iter;
			}
		}
	}

//	for (unsigned int i = 0; i < mJointUpdateOrder.size(); i++) {
//		std::cout << "i = " << i << ": joint_id = " << mJointUpdateOrder[i] << " joint_type = " << mJoints[mJointUpdateOrder[i]].mJointType << std::endl;
//	}

	return previously_added_body_id;
}